

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

void __thiscall BackwardPass::Optimize(BackwardPass *this)

{
  undefined1 *puVar1;
  BVSparseNode **this_00;
  AllocatorType *allocator;
  Type pBVar2;
  DictionaryStats *pDVar3;
  bool bVar4;
  Phase PVar5;
  uint uVar6;
  uint uVar7;
  JITTimeFunctionBody *pJVar8;
  FunctionJITTimeInfo *pFVar9;
  BVSparseNode *pBVar10;
  Type pDVar11;
  BVSparseNode *pBVar12;
  Type pDVar13;
  char16_t *pcVar14;
  BasicBlock *block;
  undefined1 local_220 [8];
  NoRecoverMemoryJitArenaAllocator localAlloc;
  FloatSymEquivalenceMap localFloatSymEquivalenceMap;
  NumberTempRepresentativePropertySymMap localNumberTempRepresentativePropertySym;
  BVSparse<Memory::JitArenaAllocator> local_108;
  BVSparse<Memory::JitArenaAllocator> local_e8;
  BVSparse<Memory::JitArenaAllocator> local_c8;
  BVSparse<Memory::JitArenaAllocator> local_a8;
  BVSparse<Memory::JitArenaAllocator> local_88;
  BVSparse<Memory::JitArenaAllocator> local_68;
  BVSparse<Memory::JitArenaAllocator> local_48;
  
  PVar5 = this->tag;
  if (PVar5 == BackwardPhase) {
    pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
    pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,BackwardPhase,uVar6,uVar7);
    if (bVar4) {
      return;
    }
    PVar5 = this->tag;
  }
  if (PVar5 == CaptureByteCodeRegUsePhase) {
    bVar4 = Js::PhaseIsEnabled::CaptureByteCodeRegUsePhase<Func*>(this->func);
    if (!bVar4) {
      return;
    }
    bVar4 = DoCaptureByteCodeUpwardExposedUsed(this);
    if (!bVar4) {
      return;
    }
    PVar5 = this->tag;
  }
  if (PVar5 == DeadStorePhase) {
    bVar4 = Func::DoLoopFastPaths(this->func);
    if ((!bVar4) || (bVar4 = Func::DoFastPaths(this->func), !bVar4)) {
      puVar1 = &this->func->field_0x240;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xffffffbf;
    }
    InsertArgInsForFormals(this);
    PVar5 = this->tag;
  }
  pcVar14 = L"BE-DeadStore";
  if (PVar5 == BackwardPhase) {
    pcVar14 = L"BE-Backward";
  }
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_220,pcVar14
             ,(this->func->m_alloc->super_ArenaAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
              super_ArenaData.pageAllocator,Js::Throw::OutOfMemory,(_func_void *)0x0);
  localAlloc.super_JitArenaAllocator.super_ArenaAllocator.
  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList = (void *)0x0;
  this->tempAlloc = (JitArenaAllocator *)local_220;
  bVar4 = IsTraceEnabled(this);
  if (bVar4) {
    Func::DumpHeader(this->func);
  }
  CleanupBackwardPassInfoInFlowGraph(this);
  allocator = this->tempAlloc;
  localNumberTempRepresentativePropertySym.stats = (Type)0x0;
  this->negativeZeroDoesNotMatterBySymId =
       (BVSparse<Memory::JitArenaAllocator> *)&localNumberTempRepresentativePropertySym.stats;
  local_108.lastUsedNodePrevNextField = &local_108.head;
  local_108.head = (BVSparseNode *)0x0;
  local_108.lastFoundIndex = (Type_conflict)0x0;
  this->symUsedOnlyForBitOpsBySymId =
       (BVSparse<Memory::JitArenaAllocator> *)local_108.lastUsedNodePrevNextField;
  local_e8.lastUsedNodePrevNextField = &local_e8.head;
  local_e8.head = (BVSparseNode *)0x0;
  local_e8.lastFoundIndex = (Type_conflict)0x0;
  this->symUsedOnlyForNumberBySymId =
       (BVSparse<Memory::JitArenaAllocator> *)local_e8.lastUsedNodePrevNextField;
  local_c8.lastUsedNodePrevNextField = &local_c8.head;
  local_c8.head = (BVSparseNode *)0x0;
  local_c8.lastFoundIndex = (Type_conflict)0x0;
  this->intOverflowDoesNotMatterBySymId =
       (BVSparse<Memory::JitArenaAllocator> *)local_c8.lastUsedNodePrevNextField;
  local_a8.lastUsedNodePrevNextField = &local_a8.head;
  local_a8.head = (BVSparseNode *)0x0;
  local_a8.lastFoundIndex = (Type_conflict)0x0;
  this->intOverflowDoesNotMatterInRangeBySymId =
       (BVSparse<Memory::JitArenaAllocator> *)local_a8.lastUsedNodePrevNextField;
  local_88.lastUsedNodePrevNextField = &local_88.head;
  local_88.head = (BVSparseNode *)0x0;
  local_88.lastFoundIndex = (Type_conflict)0x0;
  this->candidateSymsRequiredToBeInt =
       (BVSparse<Memory::JitArenaAllocator> *)local_88.lastUsedNodePrevNextField;
  local_68.lastUsedNodePrevNextField = &local_68.head;
  local_68.head = (BVSparseNode *)0x0;
  local_68.lastFoundIndex = (Type_conflict)0x0;
  this->candidateSymsRequiredToBeLossyInt =
       (BVSparse<Memory::JitArenaAllocator> *)local_68.lastUsedNodePrevNextField;
  local_48.lastUsedNodePrevNextField = &local_48.head;
  local_48.head = (BVSparseNode *)0x0;
  local_48.lastFoundIndex = (Type_conflict)0x0;
  this->considerSymsAsRealUsesInNoImplicitCallUses =
       (BVSparse<Memory::JitArenaAllocator> *)local_48.lastUsedNodePrevNextField;
  this->intOverflowCurrentlyMattersInRange = true;
  this_00 = &localAlloc.super_JitArenaAllocator.bvFreeList;
  local_108.alloc = allocator;
  local_e8.alloc = allocator;
  local_c8.alloc = allocator;
  local_a8.alloc = allocator;
  local_88.alloc = allocator;
  local_68.alloc = allocator;
  local_48.alloc = allocator;
  JsUtil::
  BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)this_00,allocator,0);
  this->floatSymEquivalenceMap = (FloatSymEquivalenceMap *)this_00;
  JsUtil::
  BaseDictionary<int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)&localFloatSymEquivalenceMap.stats,this->tempAlloc,0);
  this->numberTempRepresentativePropertySym =
       (NumberTempRepresentativePropertySymMap *)&localFloatSymEquivalenceMap.stats;
  for (block = this->func->m_fg->tailBlock; block != (BasicBlock *)0x0; block = block->prev) {
    if ((*(ushort *)&block->field_0x18 & 3) != 1) {
      OptBlock(this,block);
    }
  }
  if (this->tag == DeadStorePhase) {
    pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
    pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,MemOpPhase,uVar6,uVar7);
    if (!bVar4) {
      RemoveEmptyLoops(this);
    }
  }
  this->func->m_fg->hasBackwardPassInfo = true;
  bVar4 = DoTrackCompoundedIntOverflow(this);
  if (bVar4) {
    SymTable::ClearStackSymScratch(this->func->m_symTable);
  }
  PVar5 = this->tag;
  pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
  pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b3868,PVar5,uVar6,uVar7);
  if (bVar4) {
    Func::DumpHeader(this->func);
    pcVar14 = L"Deadstore Phase Stats:\n";
    if (this->tag == BackwardPhase) {
      pcVar14 = L"Backward Phase Stats:\n";
    }
    Output::Print(pcVar14);
    PVar5 = this->tag;
    if (PVar5 == DeadStorePhase) {
      bVar4 = DoDeadStore(this->func);
      if (bVar4) {
        Output::Print(L"  Deadstore              : %3d\n",(ulong)this->numDeadStore);
      }
      PVar5 = this->tag;
    }
    if ((PVar5 == BackwardPhase) && (bVar4 = SatisfyMarkTempObjectsConditions(this), bVar4)) {
      Output::Print(L"  Temp Object            : %3d\n",(ulong)this->numMarkTempObject);
    }
  }
  JsUtil::
  BaseDictionary<int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localFloatSymEquivalenceMap.stats);
  JsUtil::
  BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localAlloc.super_JitArenaAllocator.bvFreeList);
  if (local_48.head != (BVSparseNode *)0x0) {
    pBVar2 = local_48.head;
    pBVar12 = (local_48.alloc)->bvFreeList;
    do {
      pBVar10 = pBVar2;
      pBVar2 = pBVar10->next;
      pBVar10->next = pBVar12;
      pBVar12 = pBVar10;
    } while (pBVar2 != (Type)0x0);
    (local_48.alloc)->bvFreeList = pBVar10;
  }
  if (local_68.head != (BVSparseNode *)0x0) {
    pBVar2 = local_68.head;
    pBVar12 = (local_68.alloc)->bvFreeList;
    do {
      pBVar10 = pBVar2;
      pBVar2 = pBVar10->next;
      pBVar10->next = pBVar12;
      pBVar12 = pBVar10;
    } while (pBVar2 != (Type)0x0);
    (local_68.alloc)->bvFreeList = pBVar10;
  }
  if (local_88.head != (BVSparseNode *)0x0) {
    pBVar2 = local_88.head;
    pBVar12 = (local_88.alloc)->bvFreeList;
    do {
      pBVar10 = pBVar2;
      pBVar2 = pBVar10->next;
      pBVar10->next = pBVar12;
      pBVar12 = pBVar10;
    } while (pBVar2 != (Type)0x0);
    (local_88.alloc)->bvFreeList = pBVar10;
  }
  if (local_a8.head != (BVSparseNode *)0x0) {
    pBVar2 = local_a8.head;
    pBVar12 = (local_a8.alloc)->bvFreeList;
    do {
      pBVar10 = pBVar2;
      pBVar2 = pBVar10->next;
      pBVar10->next = pBVar12;
      pBVar12 = pBVar10;
    } while (pBVar2 != (Type)0x0);
    (local_a8.alloc)->bvFreeList = pBVar10;
  }
  if (local_c8.head != (BVSparseNode *)0x0) {
    pBVar2 = local_c8.head;
    pBVar12 = (local_c8.alloc)->bvFreeList;
    do {
      pBVar10 = pBVar2;
      pBVar2 = pBVar10->next;
      pBVar10->next = pBVar12;
      pBVar12 = pBVar10;
    } while (pBVar2 != (Type)0x0);
    (local_c8.alloc)->bvFreeList = pBVar10;
  }
  if (local_e8.head != (BVSparseNode *)0x0) {
    pBVar2 = local_e8.head;
    pBVar12 = (local_e8.alloc)->bvFreeList;
    do {
      pBVar10 = pBVar2;
      pBVar2 = pBVar10->next;
      pBVar10->next = pBVar12;
      pBVar12 = pBVar10;
    } while (pBVar2 != (Type)0x0);
    (local_e8.alloc)->bvFreeList = pBVar10;
  }
  if (local_108.head != (BVSparseNode *)0x0) {
    pBVar2 = local_108.head;
    pBVar12 = (local_108.alloc)->bvFreeList;
    do {
      pBVar10 = pBVar2;
      pBVar2 = pBVar10->next;
      pBVar10->next = pBVar12;
      pBVar12 = pBVar10;
    } while (pBVar2 != (Type)0x0);
    (local_108.alloc)->bvFreeList = pBVar10;
  }
  if (localNumberTempRepresentativePropertySym.stats != (Type)0x0) {
    pDVar3 = localNumberTempRepresentativePropertySym.stats;
    pDVar13 = (Type)allocator->bvFreeList;
    do {
      pDVar11 = pDVar3;
      pDVar3 = pDVar11->pNext;
      pDVar11->pNext = pDVar13;
      pDVar13 = pDVar11;
    } while (pDVar3 != (DictionaryStats *)0x0);
    allocator->bvFreeList = (BVSparseNode *)pDVar11;
  }
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_220);
  return;
}

Assistant:

void
BackwardPass::Optimize()
{
    if (tag == Js::BackwardPhase && PHASE_OFF(tag, this->func))
    {
        return;
    }

    if (tag == Js::CaptureByteCodeRegUsePhase && (!PHASE_ENABLED(CaptureByteCodeRegUsePhase, this->func) || !DoCaptureByteCodeUpwardExposedUsed()))
    {
        return;
    }

    if (tag == Js::DeadStorePhase)
    {
        if (!this->func->DoLoopFastPaths() || !this->func->DoFastPaths())
        {
            //arguments[] access is similar to array fast path hence disable when array fastpath is disabled.
            //loopFastPath is always true except explicitly disabled
            //defaultDoFastPath can be false when we the source code size is huge
            func->SetHasStackArgs(false);
        }
        InsertArgInsForFormals();
    }

    NoRecoverMemoryJitArenaAllocator localAlloc(tag == Js::BackwardPhase? _u("BE-Backward") : _u("BE-DeadStore"),
        this->func->m_alloc->GetPageAllocator(), Js::Throw::OutOfMemory);

    this->tempAlloc = &localAlloc;
#if DBG_DUMP
    if (this->IsTraceEnabled())
    {
        this->func->DumpHeader();
    }
#endif

    this->CleanupBackwardPassInfoInFlowGraph();

    // Info about whether a sym is used in a way in which -0 differs from +0, or whether the sym is used in a way in which an
    // int32 overflow when generating the value of the sym matters, in the current block. The info is transferred to
    // instructions that define the sym in the current block as they are encountered. The info in these bit vectors is discarded
    // after optimizing each block, so the only info that remains for GlobOpt is that which is transferred to instructions.
    BVSparse<JitArenaAllocator> localNegativeZeroDoesNotMatterBySymId(tempAlloc);
    negativeZeroDoesNotMatterBySymId = &localNegativeZeroDoesNotMatterBySymId;

    BVSparse<JitArenaAllocator> localSymUsedOnlyForBitOpsBySymId(tempAlloc);
    symUsedOnlyForBitOpsBySymId = &localSymUsedOnlyForBitOpsBySymId;
    BVSparse<JitArenaAllocator> localSymUsedOnlyForNumberBySymId(tempAlloc);
    symUsedOnlyForNumberBySymId = &localSymUsedOnlyForNumberBySymId;

    BVSparse<JitArenaAllocator> localIntOverflowDoesNotMatterBySymId(tempAlloc);
    intOverflowDoesNotMatterBySymId = &localIntOverflowDoesNotMatterBySymId;
    BVSparse<JitArenaAllocator> localIntOverflowDoesNotMatterInRangeBySymId(tempAlloc);
    intOverflowDoesNotMatterInRangeBySymId = &localIntOverflowDoesNotMatterInRangeBySymId;
    BVSparse<JitArenaAllocator> localCandidateSymsRequiredToBeInt(tempAlloc);
    candidateSymsRequiredToBeInt = &localCandidateSymsRequiredToBeInt;
    BVSparse<JitArenaAllocator> localCandidateSymsRequiredToBeLossyInt(tempAlloc);
    candidateSymsRequiredToBeLossyInt = &localCandidateSymsRequiredToBeLossyInt;
    BVSparse<JitArenaAllocator> localConsiderSymsAsRealUsesInNoImplicitCallUses(tempAlloc);
    considerSymsAsRealUsesInNoImplicitCallUses = &localConsiderSymsAsRealUsesInNoImplicitCallUses;
    intOverflowCurrentlyMattersInRange = true;

    FloatSymEquivalenceMap localFloatSymEquivalenceMap(tempAlloc);
    floatSymEquivalenceMap = &localFloatSymEquivalenceMap;

    NumberTempRepresentativePropertySymMap localNumberTempRepresentativePropertySym(tempAlloc);
    numberTempRepresentativePropertySym = &localNumberTempRepresentativePropertySym;

    FOREACH_BLOCK_BACKWARD_IN_FUNC_DEAD_OR_ALIVE(block, this->func)
    {
        this->OptBlock(block);
    }
    NEXT_BLOCK_BACKWARD_IN_FUNC_DEAD_OR_ALIVE;

    if (this->tag == Js::DeadStorePhase && !PHASE_OFF(Js::MemOpPhase, this->func))
    {
        this->RemoveEmptyLoops();
    }
    this->func->m_fg->hasBackwardPassInfo = true;

    if(DoTrackCompoundedIntOverflow())
    {
        // Tracking int overflow makes use of a scratch field in stack syms, which needs to be cleared
        func->m_symTable->ClearStackSymScratch();
    }

#if DBG_DUMP
    if (PHASE_STATS(this->tag, this->func))
    {
        this->func->DumpHeader();
        Output::Print(this->tag == Js::BackwardPhase? _u("Backward Phase Stats:\n") : _u("Deadstore Phase Stats:\n"));
        if (this->DoDeadStore())
        {
            Output::Print(_u("  Deadstore              : %3d\n"), this->numDeadStore);
        }
        if (this->DoMarkTempNumbers())
        {
            Output::Print(_u("  Temp Number            : %3d\n"), this->numMarkTempNumber);
            Output::Print(_u("  Transferred Temp Number: %3d\n"), this->numMarkTempNumberTransferred);
        }
        if (this->DoMarkTempObjects())
        {
            Output::Print(_u("  Temp Object            : %3d\n"), this->numMarkTempObject);
        }
    }
#endif
}